

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_context.c
# Opt level: O0

int SUNContext_GetProfiler(SUNContext sunctx,SUNProfiler *profiler)

{
  SUNProfiler *profiler_local;
  SUNContext sunctx_local;
  undefined4 local_4;
  
  if (sunctx == (SUNContext)0x0) {
    local_4 = -1;
  }
  else {
    *profiler = (SUNProfiler)0x0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int SUNContext_GetProfiler(SUNContext sunctx, SUNProfiler* profiler)
{
  if (sunctx == NULL)
  {
    return (-1);
  }

#ifdef SUNDIALS_BUILD_WITH_PROFILING
  /* get profiler */
  *profiler = sunctx->profiler;
#else
  *profiler = NULL;
#endif

  return (0);
}